

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O0

bool Am_Active_If_Selection_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *list_value;
  undefined1 local_48 [8];
  Am_Value_List selection;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object sel_widget;
  Am_Object *self_local;
  
  sel_widget.data = (Am_Object_Data *)self;
  Am_Object::Am_Object(&local_28,self);
  Am_Get_Selection_Widget_For_Command(&local_20);
  Am_Object::~Am_Object(&local_28);
  list_value = Am_Object::Get(&local_20,0x169,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_48,list_value);
  bVar1 = Am_Value_List::Empty((Am_Value_List *)local_48);
  if (bVar1) {
    self_local._7_1_ = false;
  }
  else {
    self_local._7_1_ =
         Am_Check_All_Objects_For_Inactive_Slot
                   ((Am_Value_List *)local_48,(Am_Object *)sel_widget.data);
  }
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_48);
  Am_Object::~Am_Object(&local_20);
  return self_local._7_1_;
}

Assistant:

Am_Define_Formula(bool, Am_Active_If_Selection)
{
  Am_Object sel_widget = Am_Get_Selection_Widget_For_Command(self);
  Am_Value_List selection = sel_widget.Get(Am_VALUE);
  if (!selection.Empty()) {
    return Am_Check_All_Objects_For_Inactive_Slot(selection, self);
  } else
    return false;
}